

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

string * __thiscall
cxxopts::values::abstract_value<unsigned_long>::get_default_value_abi_cxx11_
          (string *__return_storage_ptr__,abstract_value<unsigned_long> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_default_value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_default_value)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_default_value() const
      {
        return m_default_value;
      }